

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Task.cpp
# Opt level: O2

void __thiscall Task::Task(Task *this,int _max_task_size)

{
  this->max_task_num = _max_task_size;
  std::
  queue<std::shared_ptr<channel>,std::deque<std::shared_ptr<channel>,std::allocator<std::shared_ptr<channel>>>>
  ::queue<std::deque<std::shared_ptr<channel>,std::allocator<std::shared_ptr<channel>>>,void>
            (&this->product_task);
  std::
  queue<std::shared_ptr<channel>,std::deque<std::shared_ptr<channel>,std::allocator<std::shared_ptr<channel>>>>
  ::queue<std::deque<std::shared_ptr<channel>,std::allocator<std::shared_ptr<channel>>>,void>
            (&this->consum_task);
  pthread_mutex_init((pthread_mutex_t *)&this->Product_Mutex,(pthread_mutexattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)&this->Comsumer_Mutex,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&this->Swap_Cond,(pthread_condattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&this->ComsumCond,(pthread_condattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&this->ProductCond,(pthread_condattr_t *)0x0);
  pthread_create(&this->swap_thread,(pthread_attr_t *)0x0,swap_task,this);
  return;
}

Assistant:

Task::Task(int _max_task_size):
max_task_num(_max_task_size)
{
    pthread_mutex_init(&Product_Mutex,NULL);
    pthread_mutex_init(&Comsumer_Mutex,NULL);
    pthread_cond_init(&Swap_Cond,NULL);
    pthread_cond_init(&ComsumCond,NULL);
    pthread_cond_init(&ProductCond,NULL);
    pthread_create(&swap_thread,NULL,Task::swap_task,(void*)(this));
}